

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall xmrig::Arguments::Arguments(Arguments *this,int argc,char **argv)

{
  undefined8 in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  size_t i;
  char *in_stack_00000048;
  Arguments *in_stack_00000050;
  ulong local_30;
  
  *in_RDI = in_RDX;
  *(int *)(in_RDI + 1) = in_ESI;
  std::vector<xmrig::String,_std::allocator<xmrig::String>_>::vector
            ((vector<xmrig::String,_std::allocator<xmrig::String>_> *)0x1d4a19);
  uv_setup_args(in_ESI,in_RDX);
  for (local_30 = 0; local_30 < (ulong)(long)in_ESI; local_30 = local_30 + 1) {
    add(in_stack_00000050,in_stack_00000048);
  }
  return;
}

Assistant:

xmrig::Arguments::Arguments(int argc, char **argv) :
    m_argv(argv),
    m_argc(argc)
{
    uv_setup_args(argc, argv);

    for (size_t i = 0; i < static_cast<size_t>(argc); ++i) {
        add(argv[i]);
    }
}